

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::remove_index
          (array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *this,
          int index)

{
  char *__dest;
  long lVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = this->num_elements;
  if (index + 1 < iVar2) {
    lVar3 = (long)index + 1;
    lVar1 = (long)index * 0xa0;
    do {
      __dest = this->list->m_aName + lVar1;
      memcpy(__dest,__dest + 0xa0,0xa0);
      lVar3 = lVar3 + 1;
      iVar2 = this->num_elements;
      lVar1 = lVar1 + 0xa0;
    } while (lVar3 < iVar2);
  }
  iVar2 = iVar2 + -1;
  if (this->list_size < iVar2) {
    alloc(this,iVar2);
  }
  this->num_elements = iVar2;
  return;
}

Assistant:

void remove_index(int index)
	{
		for(int i = index+1; i < num_elements; i++)
			list[i-1] = list[i];

		set_size(size()-1);
	}